

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsDenseDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  long lVar3;
  sunindextype sVar4;
  realtype *prVar5;
  realtype *prVar6;
  long in_RCX;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  realtype rVar7;
  int retval;
  CVLsMem cvls_mem;
  sunindextype N;
  sunindextype j;
  N_Vector jthCol;
  N_Vector ftemp;
  realtype *cns_data;
  realtype *ewt_data;
  realtype *y_data;
  realtype conj;
  realtype srur;
  realtype yjsaved;
  realtype inc_inv;
  realtype inc;
  realtype minInc;
  realtype fnorm;
  N_Vector in_stack_ffffffffffffff38;
  N_Vector in_stack_ffffffffffffff40;
  N_Vector p_Var8;
  N_Vector x;
  double dVar9;
  double a;
  int local_a4;
  int local_94;
  realtype *local_80;
  N_Vector local_48;
  
  local_a4 = 0;
  local_80 = (realtype *)0x0;
  lVar3 = *(long *)(in_RCX + 0x408);
  sVar4 = SUNDenseMatrix_Columns((SUNMatrix)in_stack_ffffffffffffff38);
  N_VCloneEmpty(in_stack_ffffffffffffff40);
  prVar5 = N_VGetArrayPointer((N_Vector)0xefd901);
  prVar6 = N_VGetArrayPointer((N_Vector)0xefd913);
  if (*(int *)(in_RCX + 0x58) != 0) {
    local_80 = N_VGetArrayPointer((N_Vector)0xefd93a);
  }
  if (0.0 < *(double *)(in_RCX + 8)) {
    dVar9 = sqrt(*(double *)(in_RCX + 8));
  }
  else {
    dVar9 = 0.0;
  }
  a = dVar9;
  rVar7 = N_VWrmsNorm(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((rVar7 != 0.0) || (NAN(rVar7))) {
    p_Var8 = (N_Vector)
             (ABS(*(double *)(in_RCX + 0x140)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar4 *
             rVar7);
  }
  else {
    p_Var8 = (N_Vector)&DAT_3ff0000000000000;
  }
  x = p_Var8;
  for (local_94 = 0; local_94 < sVar4; local_94 = local_94 + 1) {
    SUNDenseMatrix_Column((SUNMatrix)in_stack_ffffffffffffff38,0);
    N_VSetArrayPointer((realtype *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    dVar1 = prVar6[local_94];
    if (dVar9 * ABS(dVar1) <= (double)p_Var8 / prVar5[local_94]) {
      in_stack_ffffffffffffff40 = (N_Vector)((double)p_Var8 / prVar5[local_94]);
    }
    else {
      in_stack_ffffffffffffff40 = (N_Vector)(dVar9 * ABS(dVar1));
    }
    local_48 = in_stack_ffffffffffffff40;
    if (*(int *)(in_RCX + 0x58) != 0) {
      dVar2 = local_80[local_94];
      if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
        if ((ABS(dVar2) == 2.0) &&
           ((!NAN(ABS(dVar2)) && ((dVar1 + (double)in_stack_ffffffffffffff40) * dVar2 <= 0.0)))) {
          local_48 = (N_Vector)((ulong)in_stack_ffffffffffffff40 ^ 0x8000000000000000);
        }
      }
      else if ((dVar1 + (double)in_stack_ffffffffffffff40) * dVar2 < 0.0) {
        local_48 = (N_Vector)((ulong)in_stack_ffffffffffffff40 ^ 0x8000000000000000);
      }
    }
    prVar6[local_94] = (double)local_48 + prVar6[local_94];
    local_a4 = (**(code **)(in_RCX + 0x10))(in_XMM0_Qa,in_RDI,in_R8,*(undefined8 *)(in_RCX + 0x18));
    *(long *)(lVar3 + 0x90) = *(long *)(lVar3 + 0x90) + 1;
    if (local_a4 != 0) break;
    prVar6[local_94] = dVar1;
    N_VLinearSum(a,x,(realtype)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (N_Vector)0xefdcd1);
  }
  N_VSetArrayPointer((realtype *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  N_VDestroy((N_Vector)0xefdcf9);
  return local_a4;
}

Assistant:

int cvLsDenseDQJac(realtype t, N_Vector y, N_Vector fy,
                   SUNMatrix Jac, CVodeMem cv_mem, N_Vector tmp1)
{
  realtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  realtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for ewt, y */
  ewt_data = N_VGetArrayPointer(cv_mem->cv_ewt);
  y_data   = N_VGetArrayPointer(y);
  if (cv_mem->cv_constraintsSet)
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(cv_mem->cv_uround);
  fnorm = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) * cv_mem->cv_uround * N * fnorm) : ONE;

  for (j = 0; j < N; j++) {

    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac,j), jthCol);

    yjsaved = y_data[j];
    inc = SUNMAX(srur*SUNRabs(yjsaved), minInc/ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (cv_mem->cv_constraintsSet) {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)      {if ((yjsaved+inc)*conj < ZERO)  inc = -inc;}
      else if (SUNRabs(conj) == TWO) {if ((yjsaved+inc)*conj <= ZERO) inc = -inc;}
    }

    y_data[j] += inc;

    retval = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) break;

    y_data[j] = yjsaved;

    inc_inv = ONE/inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);

  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol);  /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return(retval);
}